

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psrah_mipsel(uint64_t fs,uint64_t ft)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  
  uVar2 = (uint)ft & 0x7f;
  uVar1 = 0xf;
  if (uVar2 < 0xf) {
    uVar1 = uVar2;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = fs;
  auVar3 = psraw(auVar3,ZEXT416(uVar1));
  return auVar3._0_8_;
}

Assistant:

uint64_t helper_psrah(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        ft = 15;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.sh[i] >>= ft;
    }
    return vs.d;
}